

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_kernel.cc
# Opt level: O1

void __thiscall ipx::BasicLuHelper::BasicLuHelper(BasicLuHelper *this,Int dim)

{
  lu_int lVar1;
  undefined8 *puVar2;
  logic_error *this_00;
  
  lVar1 = basiclu_obj_initialize(&this->obj,dim);
  if (lVar1 == 0) {
    return;
  }
  if (lVar1 == -9) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = time;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"basiclu_obj_initialize failed");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

BasicLuHelper(Int dim) {
        Int err = basiclu_obj_initialize(&obj, dim);
        if (err == BASICLU_ERROR_out_of_memory)
            throw std::bad_alloc();
        if (err != BASICLU_OK)
            throw std::logic_error("basiclu_obj_initialize failed");
    }